

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O0

void lts2::ProxProjectOntoSimplexGen(float *X,float targetMean,int n,int step)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  void *pvVar4;
  ulong uVar5;
  void *pvVar6;
  int local_50;
  int local_4c;
  int i_2;
  int i_1;
  int nonZero;
  float mu;
  int iterationCount;
  bool success;
  float *Xtilda;
  int i;
  uchar *In_complement;
  int step_local;
  int n_local;
  float targetMean_local;
  float *X_local;
  
  if (targetMean <= 0.0) {
    targetMean = 0.0;
  }
  pvVar4 = operator_new__((long)n);
  for (Xtilda._4_4_ = 0; Xtilda._4_4_ < n; Xtilda._4_4_ = Xtilda._4_4_ + 1) {
    *(undefined1 *)((long)pvVar4 + (long)Xtilda._4_4_) = 0xff;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)n;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  bVar3 = false;
  for (nonZero = 0; !bVar3 && nonZero < n; nonZero = nonZero + 1) {
    bVar3 = true;
    i_1 = 0;
    i_2 = 0;
    for (local_4c = 0; local_4c < n; local_4c = local_4c + 1) {
      if (*(char *)((long)pvVar4 + (long)local_4c) != '\0') {
        i_1 = (int)(X[local_4c * step] + (float)i_1);
        i_2 = i_2 + 1;
      }
    }
    for (local_50 = 0; local_50 < n; local_50 = local_50 + 1) {
      if (*(char *)((long)pvVar4 + (long)local_50) == '\0') {
        *(undefined4 *)((long)pvVar6 + (long)local_50 * 4) = 0;
      }
      else {
        *(float *)((long)pvVar6 + (long)local_50 * 4) =
             X[local_50 * step] - ((float)i_1 - targetMean) / (float)i_2;
      }
      if (0.0 <= *(float *)((long)pvVar6 + (long)local_50 * 4)) {
        fVar1 = *(float *)((long)pvVar6 + (long)local_50 * 4);
      }
      else {
        fVar1 = 0.0;
      }
      X[local_50 * step] = fVar1;
      if (*(float *)((long)pvVar6 + (long)local_50 * 4) < 0.0) {
        *(undefined1 *)((long)pvVar4 + (long)local_50) = 0;
        bVar3 = false;
      }
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

void lts2::ProxProjectOntoSimplexGen(float* X, float targetMean, int n, int step)
{
  targetMean = MAX(0.0, targetMean);
    
  unsigned char* In_complement = new unsigned char[n];
  for (int i = 0; i < n; ++i)
    In_complement[i] = 255;
    
  float* Xtilda = new float[n];
    
  // Iterate
  bool success = false;
  int iterationCount = 0;
  while ( !success && iterationCount < n ) 
  {
    success = true;
        
    // Compute the mean used to project onto V_I
    float mu = 0.0;
    int nonZero = 0;
    for (int i = 0; i < n; ++i)
      if ( In_complement[i] > 0 )
      {
        mu += X[i*step];
        ++nonZero;
      }
    mu -= targetMean;
    mu /= nonZero;
        
    // Compute projections onto V_I and X_I together
    // Note that we can test at the same time the convergence:
    // we have converged when all the components of X tilda are positive.
    for (int i = 0; i < n; ++i)
    {
      // Projection onto V_I : enforce the summation to 1
      if ( In_complement[i] > 0 )
        Xtilda[i] = X[i*step] - mu;
      else
        Xtilda[i] = 0.0;
            
      // Projection onto X_I : enforce the positivity
      X[i*step] = MAX(Xtilda[i], 0.0);
            
      // Convergence check
      if ( Xtilda[i] < 0.0 )
      {
        In_complement[i] = 0;
        success = false;
      }
    }
        
    ++iterationCount;
  }
    
    
  // Release memory
  delete []In_complement;
  delete []Xtilda;
}